

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O2

void __thiscall
deci_FlexLexer::deci_FlexLexer(deci_FlexLexer *this,istream *arg_yyin,ostream *arg_yyout)

{
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0011dce8;
  std::istream::istream
            (&this->yyin,*(streambuf **)(arg_yyin + *(long *)(*(long *)arg_yyin + -0x18) + 0xe8));
  std::ostream::ostream
            (&this->yyout,*(streambuf **)(arg_yyout + *(long *)(*(long *)arg_yyout + -0x18) + 0xe8))
  ;
  ctor_common(this);
  return;
}

Assistant:

yyFlexLexer::yyFlexLexer( std::istream& arg_yyin, std::ostream& arg_yyout ):
	yyin(arg_yyin.rdbuf()),
	yyout(arg_yyout.rdbuf())
{
	ctor_common();
}